

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<ReturnStatementAstNode>_> * __thiscall
Parser::parseReturnStatement
          (optional<std::shared_ptr<ReturnStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool *this_00;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar3;
  undefined1 local_98 [16];
  shared_ptr<Token> returnToken;
  size_type __dnew_1;
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48 [2];
  byte local_31;
  bool error;
  
  local_31 = 0;
  __dnew_1 = 0x11;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = local_48;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,(ulong)&__dnew_1);
  this_00 = &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged;
  local_48[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__dnew_1;
  builtin_strncpy((char *)expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected a return",0x11);
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__dnew_1;
  *(char *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ + __dnew_1) =
       '\0';
  expect((Parser *)&stack0xffffffffffffff78,(TokenType)this,(bool *)0xa,(string *)&local_31);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != local_48) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,(ulong)((long)&local_48[0]->_vptr__Sp_counted_base + 1));
  }
  skipWhiteSpace(this);
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0;
  TokenBuffer::currentToken((TokenBuffer *)this_00);
  iVar1 = *(int *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ + 0x20);
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  if (iVar1 != 0x10) {
    parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)this_00,this);
    std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_copy_assign
              ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)&__dnew_1,
               (_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)this_00);
    if ((char)local_48[0] == '\x01') {
      local_48[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((ulong)local_48[0] & 0xffffffffffffff00);
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
    }
  }
  returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x32;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = local_48;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,
                  (ulong)&returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  local_48[0] = returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  builtin_strncpy((char *)expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected a semicolon to terminate return statement",0x32);
  local_50._M_pi =
       returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(char *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
           (long)returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           ) = '\0';
  expect((Parser *)local_98,(TokenType)this,(bool *)0x10,(string *)&local_31);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != local_48) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,(ulong)((long)&local_48[0]->_vptr__Sp_counted_base + 1));
  }
  if (iVar1 == 0x10) {
    if (local_31 != 0) {
LAB_0010b72e:
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_engaged = false;
      goto LAB_0010b787;
    }
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ReturnStatementAstNode,std::allocator<ReturnStatementAstNode>,std::shared_ptr<Token>&>
              (&local_50,
               (ReturnStatementAstNode **)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
               (_Sp_alloc_shared_tag<std::allocator<ReturnStatementAstNode>_>)
               &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<Token> *)&stack0xffffffffffffff78);
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ReturnStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ReturnStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_50._M_pi;
  }
  else {
    bVar3 = local_31 == 0;
    local_31 = 1;
    if (bVar3) {
      local_31 = expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_
                 ^ 1;
    }
    if ((local_31 & 1) != 0) goto LAB_0010b72e;
    if ((expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ & 1) ==
        0) {
      std::__throw_bad_optional_access();
    }
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ff38;
    __gnu_cxx::new_allocator<ReturnStatementAstNode>::
    construct<ReturnStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
              ((new_allocator<ReturnStatementAstNode> *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
               (ReturnStatementAstNode *)(p_Var2 + 1),(shared_ptr<Token> *)&stack0xffffffffffffff78,
               (shared_ptr<ExpressionAstNode> *)&__dnew_1);
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ReturnStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ReturnStatementAstNode *)(p_Var2 + 1);
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ReturnStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_engaged = true;
LAB_0010b787:
  if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01')
  {
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0;
    if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._M_value.
        super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if (returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ReturnStatementAstNode>>
Parser::parseReturnStatement() noexcept {
  bool error = false;

  auto returnToken = this->expect(TokenType::Return, error, "Expected a return");

  this->skipWhiteSpace();

  bool foundExpression = false;
  std::optional<std::shared_ptr<ExpressionAstNode>> expression{std::nullopt};

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::SemiColon) {
    foundExpression = true;
    expression = this->parseExpression();
  }

  this->expect(TokenType::SemiColon, error, "Expected a semicolon to terminate return statement");

  if (foundExpression) {
    error = error || !expression;
  }

  if (error) { return std::nullopt; }

  if (foundExpression) {
    return std::make_shared<ReturnStatementAstNode>(returnToken, expression.value());
  }

  return std::make_shared<ReturnStatementAstNode>(returnToken);
}